

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O0

void __thiscall MyEntity::MyEntity(MyEntity *this,string *n)

{
  undefined8 *in_RDI;
  int p;
  undefined8 *fun;
  MyEntity *in_stack_ffffffffffffffb8;
  GEvent<MyEntity> *in_stack_ffffffffffffffc0;
  code *this_00;
  
  MetaSim::Entity::Entity((Entity *)in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__MyEntity_0022b3c8;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  fun = in_RDI + 7;
  p = (int)((ulong)in_RDI >> 0x20);
  MetaSim::GEvent<MyEntity>::GEvent
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(Pmemfun)fun,p);
  this_00 = onEventB;
  MetaSim::GEvent<MyEntity>::GEvent
            ((GEvent<MyEntity> *)onEventB,in_stack_ffffffffffffffb8,(Pmemfun)fun,p);
  MetaSim::GEvent<MyEntity>::GEvent((GEvent<MyEntity> *)this_00,(MyEntity *)0x0,(Pmemfun)fun,p);
  return;
}

Assistant:

MyEntity::MyEntity(const std::string &n) : Entity(n),
					   afirst(false),
					   bfirst(false),
					   count(0),
					   eventA(this, &MyEntity::onEventA),
					   eventB(this, &MyEntity::onEventB),
					   eventC(this, &MyEntity::onEventC)
{
}